

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O1

bool __thiscall
glcts::anon_unknown_0::LayoutSpecifierBase::isImplicit
          (LayoutSpecifierBase *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *stages)

{
  bool bVar1;
  pointer puVar2;
  bool bVar3;
  ulong uVar4;
  
  puVar2 = (stages->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((stages->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish == puVar2) {
    bVar3 = true;
  }
  else {
    bVar3 = true;
    uVar4 = 0;
    do {
      bVar1 = DefOccurence::occurs(&this->occurence,puVar2[uVar4]);
      bVar3 = (bool)(bVar3 & !bVar1);
      uVar4 = uVar4 + 1;
      puVar2 = (stages->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(stages->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2));
  }
  return bVar3;
}

Assistant:

ShaderKey(GLenum _stage, const std::string& _input, const std::string& _output)
		: stage(_stage), input(_input), output(_output)
	{
	}